

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i64_Trunc_f64s(w3Interp *this)

{
  double *pdVar1;
  w3Interp *this_local;
  
  pdVar1 = w3Stack::f64(&this->super_w3Stack);
  w3Stack::set_i64(&this->super_w3Stack,(long)*pdVar1);
  return;
}

Assistant:

INTERP (i64_Trunc_f64s)
{
    set_i64 ((int64_t)f64 ());
}